

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor.cpp
# Opt level: O0

void __thiscall
FIX::SocketMonitor::processExceptSet(SocketMonitor *this,Strategy *strategy,fd_set *exceptSet)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  uint *puVar4;
  reference piVar5;
  iterator iStack_68;
  int s;
  _Base_ptr local_60;
  undefined1 local_58 [8];
  Sockets sockets;
  iterator i;
  fd_set *exceptSet_local;
  Strategy *strategy_local;
  SocketMonitor *this_local;
  
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<int> *)
             &sockets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58,&this->m_connectSockets);
  local_60 = (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58);
  sockets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_60;
  while( true ) {
    iStack_68 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58);
    bVar3 = std::operator!=((_Self *)&sockets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            &stack0xffffffffffffff98);
    if (!bVar3) break;
    puVar4 = (uint *)std::_Rb_tree_const_iterator<int>::operator*
                               ((_Rb_tree_const_iterator<int> *)
                                &sockets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    uVar1 = *puVar4;
    piVar5 = std::_Rb_tree_const_iterator<int>::operator*
                       ((_Rb_tree_const_iterator<int> *)
                        &sockets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    uVar2 = exceptSet->fds_bits[*piVar5 / 0x40];
    piVar5 = std::_Rb_tree_const_iterator<int>::operator*
                       ((_Rb_tree_const_iterator<int> *)
                        &sockets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if ((uVar2 & 1L << ((byte)((long)*piVar5 % 0x40) & 0x3f)) != 0) {
      (*strategy->_vptr_Strategy[5])(strategy,this,(ulong)uVar1);
    }
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)
               &sockets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58);
  return;
}

Assistant:

void SocketMonitor::processExceptSet( Strategy& strategy, fd_set& exceptSet )
{
#ifdef _MSC_VER
  for ( unsigned i = 0; i < exceptSet.fd_count; ++i )
  {
    int s = exceptSet.fd_array[ i ];
    strategy.onError( *this, s );
  }
#else
    Sockets::iterator i;
    Sockets sockets = m_connectSockets;
    for ( i = sockets.begin(); i != sockets.end(); ++i )
    {
      int s = *i;
      if ( !FD_ISSET( *i, &exceptSet ) )
        continue;
      strategy.onError( *this, s );
    }
#endif
}